

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobalObject.cpp
# Opt level: O3

HRESULT __thiscall
Js::GlobalObject::SetDirectHostObject
          (GlobalObject *this,RecyclableObject *hostObject,RecyclableObject *secureDirectHostObject)

{
  Var pvVar1;
  AutoNestedHandledExceptionType local_2c [2];
  AutoNestedHandledExceptionType __autoNestedHandledExceptionType;
  
  Memory::Recycler::WBSetBit((char *)&this->directHostObject);
  (this->directHostObject).ptr = hostObject;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(&this->directHostObject);
  Memory::Recycler::WBSetBit((char *)&this->secureDirectHostObject);
  (this->secureDirectHostObject).ptr = secureDirectHostObject;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(&this->secureDirectHostObject);
  AutoNestedHandledExceptionType::AutoNestedHandledExceptionType(local_2c,ExceptionType_OutOfMemory)
  ;
  (*(this->super_RootObjectBase).super_DynamicObject.super_RecyclableObject.super_FinalizableObject.
    super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x4b])
            (this,(((this->library).ptr)->super_JavascriptLibraryBase).nullValue.ptr);
  if (((((((((this->super_RootObjectBase).super_DynamicObject.super_RecyclableObject.type.ptr)->
           javascriptLibrary).ptr)->super_JavascriptLibraryBase).scriptContext.ptr)->config).
      threadConfig)->m_ESGlobalThis == true) {
    pvVar1 = ToThis(this);
    (*(this->super_RootObjectBase).super_DynamicObject.super_RecyclableObject.
      super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x17])
              (this,0x1a1,pvVar1,0,0);
  }
  AutoNestedHandledExceptionType::~AutoNestedHandledExceptionType(local_2c);
  return 0;
}

Assistant:

HRESULT GlobalObject::SetDirectHostObject(RecyclableObject* hostObject, RecyclableObject* secureDirectHostObject)
    {
        HRESULT hr = S_OK;

        this->directHostObject = hostObject;
        this->secureDirectHostObject = secureDirectHostObject;

        BEGIN_TRANSLATE_OOM_TO_HRESULT_NESTED
        {
            // In fastDOM scenario, we should use the host object to lookup the prototype.
            this->SetPrototype(library->GetNull());

            // Host can call to set the direct host object after the GlobalObject has been initialized but
            // before user script has run. (This happens even before the previous call to SetPrototype)
            // If that happens, we'll need to update the 'globalThis' property to point to the secure
            // host object so that we don't hand a reference to the bare GlobalObject out to user script.
            if (this->GetScriptContext()->GetConfig()->IsESGlobalThisEnabled())
            {
                this->SetProperty(PropertyIds::globalThis, this->ToThis(), PropertyOperation_None, nullptr);
            }
        }